

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  size_t sVar2;
  Colour colourGuard;
  char local_21;
  
  poVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam0000000000193fd0 = 0x2d2d2d2d2d2d2d;
    uRam0000000000193fd7._0_1_ = '-';
    uRam0000000000193fd7._1_1_ = '-';
    uRam0000000000193fd7._2_1_ = '-';
    uRam0000000000193fd7._3_1_ = '-';
    uRam0000000000193fd7._4_1_ = '-';
    uRam0000000000193fd7._5_1_ = '-';
    uRam0000000000193fd7._6_1_ = '-';
    uRam0000000000193fd7._7_1_ = '-';
    DAT_00193fc0 = '-';
    DAT_00193fc0_1._0_1_ = '-';
    DAT_00193fc0_1._1_1_ = '-';
    DAT_00193fc0_1._2_1_ = '-';
    DAT_00193fc0_1._3_1_ = '-';
    DAT_00193fc0_1._4_1_ = '-';
    DAT_00193fc0_1._5_1_ = '-';
    DAT_00193fc0_1._6_1_ = '-';
    uRam0000000000193fc8 = 0x2d2d2d2d2d2d2d;
    DAT_00193fcf = 0x2d;
    DAT_00193fb0 = '-';
    DAT_00193fb0_1._0_1_ = '-';
    DAT_00193fb0_1._1_1_ = '-';
    DAT_00193fb0_1._2_1_ = '-';
    DAT_00193fb0_1._3_1_ = '-';
    DAT_00193fb0_1._4_1_ = '-';
    DAT_00193fb0_1._5_1_ = '-';
    DAT_00193fb0_1._6_1_ = '-';
    uRam0000000000193fb8._0_1_ = '-';
    uRam0000000000193fb8._1_1_ = '-';
    uRam0000000000193fb8._2_1_ = '-';
    uRam0000000000193fb8._3_1_ = '-';
    uRam0000000000193fb8._4_1_ = '-';
    uRam0000000000193fb8._5_1_ = '-';
    uRam0000000000193fb8._6_1_ = '-';
    uRam0000000000193fb8._7_1_ = '-';
    DAT_00193fa0 = '-';
    DAT_00193fa0_1._0_1_ = '-';
    DAT_00193fa0_1._1_1_ = '-';
    DAT_00193fa0_1._2_1_ = '-';
    DAT_00193fa0_1._3_1_ = '-';
    DAT_00193fa0_1._4_1_ = '-';
    DAT_00193fa0_1._5_1_ = '-';
    DAT_00193fa0_1._6_1_ = '-';
    uRam0000000000193fa8._0_1_ = '-';
    uRam0000000000193fa8._1_1_ = '-';
    uRam0000000000193fa8._2_1_ = '-';
    uRam0000000000193fa8._3_1_ = '-';
    uRam0000000000193fa8._4_1_ = '-';
    uRam0000000000193fa8._5_1_ = '-';
    uRam0000000000193fa8._6_1_ = '-';
    uRam0000000000193fa8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam0000000000193f98._0_1_ = '-';
    uRam0000000000193f98._1_1_ = '-';
    uRam0000000000193f98._2_1_ = '-';
    uRam0000000000193f98._3_1_ = '-';
    uRam0000000000193f98._4_1_ = '-';
    uRam0000000000193f98._5_1_ = '-';
    uRam0000000000193f98._6_1_ = '-';
    uRam0000000000193f98._7_1_ = '-';
    DAT_00193fdf = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_21,1);
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::use(None);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}